

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__5,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  size_type in_R9;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  UntypedFormatSpecImpl format;
  ulong local_38;
  code *local_30;
  ulong local_28;
  code *local_20;
  functional_internal *local_18;
  code *local_10;
  
  local_18 = this + 8;
  local_38 = (ulong)*(byte *)(*(long *)this + 0x28);
  local_30 = str_format_internal::FormatArgImpl::Dispatch<char>;
  local_20 = str_format_internal::FormatArgImpl::Dispatch<char>;
  local_10 = str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  args.len_ = in_R9;
  args.ptr_ = (pointer)0x3;
  format.size_ = (size_t)&local_38;
  format.data_ = (void *)0x33;
  local_28 = local_38;
  str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,
             (str_format_internal *)"annotation range was not closed; expected %c}%c: %s",format,
             args);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}